

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreInlines.h
# Opt level: O0

bool __thiscall PowerCore::conditional(PowerCore *this,uint32_t BO,uint32_t BI)

{
  bool bVar1;
  bool local_2a;
  bool local_1a;
  bool cond_ok;
  bool ctr_ok;
  uint32_t BI_local;
  uint32_t BO_local;
  PowerCore *this_local;
  
  if ((BO & 4) == 0) {
    (this->super_PowerCoreState).ctr = (this->super_PowerCoreState).ctr - 1;
    if ((BO & 2) == 0) {
      bVar1 = (this->super_PowerCoreState).ctr != 0;
    }
    else {
      bVar1 = (this->super_PowerCoreState).ctr == 0;
    }
  }
  else {
    bVar1 = true;
  }
  if ((BO & 0x10) == 0) {
    if ((BO & 8) == 0) {
      local_1a = ((this->super_PowerCoreState).cr & 0x80000000U >> ((byte)BI & 0x1f)) == 0;
    }
    else {
      local_1a = ((this->super_PowerCoreState).cr & 0x80000000U >> ((byte)BI & 0x1f)) != 0;
    }
  }
  else {
    local_1a = true;
  }
  local_2a = false;
  if (bVar1) {
    local_2a = local_1a;
  }
  return local_2a;
}

Assistant:

inline bool PowerCore::conditional(uint32_t BO, uint32_t BI)
{
    bool ctr_ok;
    if((BO & 0x4) == 0)
    {
        --ctr;
        ctr_ok = (BO & 0x2) ? ctr == 0 : ctr != 0;
    }
    else
    {
        ctr_ok = true;
    }
    bool cond_ok;
    if(BO & 0x10)
        cond_ok = true;
    else if(BO & 0x8)
        cond_ok = (cr & (0x80000000U >> BI)) != 0;
    else
        cond_ok = (cr & (0x80000000U >> BI)) == 0;

    return ctr_ok && cond_ok;
}